

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Master.cpp
# Opt level: O0

void __thiscall Master::Master(Master *this)

{
  int fromVersion;
  QSettings *pQVar1;
  Master *ctx;
  undefined1 auVar2 [12];
  QList<const_AudioDevice_*> local_238;
  QVariant local_220;
  QString local_200;
  QVariant local_1e8;
  QString local_1c8;
  QVariant local_1b0;
  QString local_190;
  QVariant local_178;
  QString local_158;
  QVariant local_140;
  QString local_120;
  QVariant local_108;
  QString local_e8;
  QVariant local_d0;
  QString local_b0;
  QVariant local_98;
  int local_78;
  undefined1 local_71;
  int settingsVersion;
  QString local_58;
  undefined4 local_3c;
  undefined8 local_38;
  QMessageLogger local_30;
  Master *local_10;
  Master *this_local;
  
  local_10 = this;
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_0020e630;
  QList<SynthRoute_*>::QList(&this->synthRoutes);
  QList<AudioDriver_*>::QList(&this->audioDrivers);
  QList<const_AudioDevice_*>::QList(&this->audioDevices);
  QString::QString(&this->synthProfileName);
  QString::QString(&this->defaultAudioDriverId);
  QString::QString(&this->defaultAudioDeviceName);
  if (instance != (Master *)0x0) {
    QMessageLogger::QMessageLogger(&local_30,(char *)0x0,0,(char *)0x0);
    auVar2 = QMessageLogger::fatal((char *)&local_30,"Master already instantiated!");
    local_3c = auVar2._8_4_;
    local_38 = auVar2._0_8_;
    QString::~QString(&this->defaultAudioDeviceName);
    QString::~QString(&this->defaultAudioDriverId);
    QString::~QString(&this->synthProfileName);
    QList<const_AudioDevice_*>::~QList(&this->audioDevices);
    QList<AudioDriver_*>::~QList(&this->audioDrivers);
    QList<SynthRoute_*>::~QList(&this->synthRoutes);
    QObject::~QObject(&this->super_QObject);
    _Unwind_Resume(local_38);
  }
  instance = this;
  this->maxSessions = 0;
  QCoreApplication::instance();
  QObject::thread();
  ctx = this;
  QObject::moveToThread((QThread *)this);
  MasterClock::init((EVP_PKEY_CTX *)ctx);
  pQVar1 = (QSettings *)operator_new(0x10);
  local_71 = 1;
  QString::QString(&local_58,"muntemu.org");
  QString::QString((QString *)&settingsVersion,"Munt mt32emu-qt");
  QSettings::QSettings(pQVar1,(QString *)&local_58,(QString *)&settingsVersion,(QObject *)0x0);
  local_71 = 0;
  this->settings = pQVar1;
  QString::~QString((QString *)&settingsVersion);
  QString::~QString(&local_58);
  pQVar1 = this->settings;
  QString::QString(&local_b0,"Master/settingsVersion");
  QVariant::QVariant(&local_d0,1);
  QSettings::value((QString *)&local_98,(QVariant *)pQVar1);
  fromVersion = QVariant::toInt((bool *)&local_98);
  QVariant::~QVariant(&local_98);
  QVariant::~QVariant(&local_d0);
  QString::~QString(&local_b0);
  local_78 = fromVersion;
  if (fromVersion != 2) {
    migrateSettings(this->settings,fromVersion);
  }
  pQVar1 = this->settings;
  QString::QString(&local_120,"Master/defaultSynthProfile");
  QVariant::QVariant(&local_140,"default");
  QSettings::value((QString *)&local_108,(QVariant *)pQVar1);
  QVariant::toString();
  QString::operator=(&this->synthProfileName,&local_e8);
  QString::~QString(&local_e8);
  QVariant::~QVariant(&local_108);
  QVariant::~QVariant(&local_140);
  QString::~QString(&local_120);
  this->trayIcon = (QSystemTrayIcon *)0x0;
  pQVar1 = this->settings;
  QString::QString(&local_190,"Master/DefaultAudioDriver");
  QVariant::QVariant(&local_1b0);
  QSettings::value((QString *)&local_178,(QVariant *)pQVar1);
  QVariant::toString();
  QString::operator=(&this->defaultAudioDriverId,&local_158);
  QString::~QString(&local_158);
  QVariant::~QVariant(&local_178);
  QVariant::~QVariant(&local_1b0);
  QString::~QString(&local_190);
  pQVar1 = this->settings;
  QString::QString(&local_200,"Master/DefaultAudioDevice");
  QVariant::QVariant(&local_220);
  QSettings::value((QString *)&local_1e8,(QVariant *)pQVar1);
  QVariant::toString();
  QString::operator=(&this->defaultAudioDeviceName,&local_1c8);
  QString::~QString(&local_1c8);
  QVariant::~QVariant(&local_1e8);
  QVariant::~QVariant(&local_220);
  QString::~QString(&local_200);
  initAudioDrivers(this);
  initMidiDrivers(this);
  this->lastAudioDeviceScan = -4000000000;
  getAudioDevices(&local_238,this);
  QList<const_AudioDevice_*>::~QList(&local_238);
  this->pinnedSynthRoute = (SynthRoute *)0x0;
  this->audioFileWriterSynth = (QSynth *)0x0;
  qRegisterMetaType<MidiDriver*>("MidiDriver*");
  qRegisterMetaType<MidiSession*>("MidiSession*");
  qRegisterMetaType<MidiSession**>("MidiSession**");
  qRegisterMetaType<SynthState>("SynthState");
  return;
}

Assistant:

Master::Master() {
	if (instance != NULL) {
		qFatal("Master already instantiated!");
		// Do nothing if ignored
		return;
	}
	instance = this;
	maxSessions = 0;

	moveToThread(QCoreApplication::instance()->thread());

	MasterClock::init();

	settings = new QSettings("muntemu.org", "Munt mt32emu-qt");
	int settingsVersion = settings->value("Master/settingsVersion", 1).toInt();
	if (settingsVersion != ACTUAL_SETTINGS_VERSION) {
		migrateSettings(*settings, settingsVersion);
	}

	synthProfileName = settings->value("Master/defaultSynthProfile", "default").toString();

	trayIcon = NULL;
	defaultAudioDriverId = settings->value("Master/DefaultAudioDriver").toString();
	defaultAudioDeviceName = settings->value("Master/DefaultAudioDevice").toString();

	initAudioDrivers();
	initMidiDrivers();
	lastAudioDeviceScan = -4 * MasterClock::NANOS_PER_SECOND;
	getAudioDevices();
	pinnedSynthRoute = NULL;
	audioFileWriterSynth = NULL;

	qRegisterMetaType<MidiDriver *>("MidiDriver*");
	qRegisterMetaType<MidiSession *>("MidiSession*");
	qRegisterMetaType<MidiSession **>("MidiSession**");
	qRegisterMetaType<SynthState>("SynthState");
}